

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O3

char * searchpath(lua_State *L,char *name,char *path,char *sep,char *dirsep)

{
  char *pcVar1;
  char *pcVar2;
  FILE *__stream;
  size_t len;
  luaL_Buffer msg;
  luaL_Buffer local_2050;
  
  luaL_buffinit(L,&local_2050);
  if (*sep != '\0') {
    name = luaL_gsub(L,name,sep,dirsep);
  }
  while( true ) {
    for (; *path == ';'; path = path + 1) {
    }
    if (*path == '\0') break;
    pcVar1 = strchr(path,0x3b);
    if (pcVar1 == (char *)0x0) {
      len = strlen(path);
      pcVar1 = path + len;
    }
    else {
      len = (long)pcVar1 - (long)path;
    }
    lua_pushlstring(L,path,len);
    pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
    pcVar2 = luaL_gsub(L,pcVar2,"?",name);
    lua_rotate(L,-2,-1);
    lua_settop(L,-2);
    __stream = fopen64(pcVar2,"r");
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
      return pcVar2;
    }
    lua_pushfstring(L,"\n\tno file \'%s\'",pcVar2);
    lua_rotate(L,-2,-1);
    lua_settop(L,-2);
    luaL_addvalue(&local_2050);
    path = pcVar1;
  }
  luaL_pushresult(&local_2050);
  return (char *)0x0;
}

Assistant:

static const char *searchpath (lua_State *L, const char *name,
                                             const char *path,
                                             const char *sep,
                                             const char *dirsep) {
  luaL_Buffer buff;
  char *pathname;  /* path with name inserted */
  char *endpathname;  /* its end */
  const char *filename;
  /* separator is non-empty and appears in 'name'? */
  if (*sep != '\0' && strchr(name, *sep) != NULL)
    name = luaL_gsub(L, name, sep, dirsep);  /* replace it by 'dirsep' */
  luaL_buffinit(L, &buff);
  /* add path to the buffer, replacing marks ('?') with the file name */
  luaL_addgsub(&buff, path, LUA_PATH_MARK, name);
  luaL_addchar(&buff, '\0');
  pathname = luaL_buffaddr(&buff);  /* writable list of file names */
  endpathname = pathname + luaL_bufflen(&buff) - 1;
  while ((filename = getnextfilename(&pathname, endpathname)) != NULL) {
    if (readable(filename))  /* does file exist and is readable? */
      return lua_pushstring(L, filename);  /* save and return name */
  }
  luaL_pushresult(&buff);  /* push path to create error message */
  pusherrornotfound(L, lua_tostring(L, -1));  /* create error message */
  return NULL;  /* not found */
}